

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O2

void load_cabal_items(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  OBJ_INDEX_DATA *pObjIndex;
  OBJ_DATA *obj;
  CHAR_DATA **ppCVar4;
  
  if ((mPort == 9999) && (__stream = fopen("../configs/citems.txt","r"), __stream != (FILE *)0x0)) {
    while (iVar2 = fread_number((FILE *)__stream), iVar2 != -1) {
      iVar3 = fread_number((FILE *)__stream);
      pObjIndex = get_obj_index((int)cabal_table[iVar2].item_vnum);
      obj = create_object(pObjIndex,0);
      if (iVar3 == 0) {
        ppCVar4 = &char_list;
        while (ppCVar4 = &((CHAR_DATA *)ppCVar4)->next->next,
              (CHAR_DATA *)ppCVar4 != (CHAR_DATA *)0x0) {
          if ((iVar2 == ((CHAR_DATA *)ppCVar4)->cabal) &&
             (bVar1 = is_cabal_guard((CHAR_DATA *)ppCVar4), bVar1)) {
            obj_to_char(obj,(CHAR_DATA *)ppCVar4);
          }
        }
      }
      else {
        ppCVar4 = &char_list;
        while (ppCVar4 = &((CHAR_DATA *)ppCVar4)->next->next,
              (CHAR_DATA *)ppCVar4 != (CHAR_DATA *)0x0) {
          if (iVar3 == ((CHAR_DATA *)ppCVar4)->pIndexData->vnum) {
            obj_to_char(obj,(CHAR_DATA *)ppCVar4);
          }
        }
      }
    }
    fclose(__stream);
    return;
  }
  return;
}

Assistant:

void load_cabal_items(void)
{
	FILE *fp;
	OBJ_DATA *obj;
	CHAR_DATA *mob;

	int inum, vnum;

	if (mPort != 9999)
		return;

	fp = fopen(CABAL_ITEMS_FILE, "r");

	if (!fp)
		return;

	while ((inum = fread_number(fp)) != -1)
	{
		vnum = fread_number(fp);
		obj = create_object(get_obj_index(cabal_table[inum].item_vnum), 0);

		if (!vnum)
		{
			for (mob = char_list; mob; mob = mob->next)
			{
				if (mob->cabal == inum && is_cabal_guard(mob))
					obj_to_char(obj, mob);
			}

			continue;
		}

		for (mob = char_list; mob; mob = mob->next)
		{
			if (mob->pIndexData->vnum == vnum)
				obj_to_char(obj, mob);
		}
	}

	fclose(fp);
}